

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t c4::to_chars(void *param_1,ulong param_2)

{
  void *pvVar1;
  size_t sVar2;
  void *__dest;
  void *in_stack_00000008;
  ulong in_stack_00000010;
  long in_stack_00000018;
  
  if (param_2 < in_stack_00000010) {
    __dest = (void *)0x0;
  }
  else {
    pvVar1 = (void *)(-in_stack_00000018 & (long)param_1 + in_stack_00000018 + -1);
    __dest = (void *)0x0;
    if ((ulong)((long)pvVar1 - (long)param_1) <= param_2 - in_stack_00000010) {
      __dest = pvVar1;
    }
  }
  if (__dest == (void *)0x0) {
    sVar2 = in_stack_00000010 + in_stack_00000018;
  }
  else {
    if ((__dest < param_1) || ((void *)((long)param_1 + param_2) < __dest)) {
      to_chars();
    }
    sVar2 = (long)__dest + (in_stack_00000010 - (long)param_1);
    if (sVar2 <= param_2) {
      memcpy(__dest,in_stack_00000008,in_stack_00000010);
    }
  }
  return sVar2;
}

Assistant:

size_t to_chars(substr buf, fmt::const_raw_wrapper r)
{
    void * vptr = buf.str;
    size_t space = buf.len;
    auto ptr = (decltype(buf.str)) std::align(r.alignment, r.len, vptr, space);
    if(ptr == nullptr)
    {
        // if it was not possible to align, return a conservative estimate
        // of the required space
        return r.alignment + r.len;
    }
    C4_CHECK(ptr >= buf.begin() && ptr <= buf.end());
    size_t sz = static_cast<size_t>(ptr - buf.str) + r.len;
    if(sz <= buf.len)
    {
        memcpy(ptr, r.buf, r.len);
    }
    return sz;
}